

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall BaseSocketImpl::~BaseSocketImpl(BaseSocketImpl *this)

{
  bool bVar1;
  BaseSocketImpl *this_local;
  
  this->_vptr_BaseSocketImpl = (_func_int **)&PTR__BaseSocketImpl_001b92c8;
  bVar1 = std::thread::joinable(&this->m_thListen);
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::thread::joinable(&this->m_thWrite);
  if (bVar1) {
    std::thread::join();
  }
  bVar1 = std::thread::joinable(&this->m_thClose);
  if (bVar1) {
    std::thread::join();
  }
  std::function<void_(BaseSocket_*,_void_*)>::~function(&this->m_fClosingParam);
  std::function<void_(BaseSocket_*)>::~function(&this->m_fClosing);
  std::function<void_(BaseSocket_*,_void_*)>::~function(&this->m_fErrorParam);
  std::function<void_(BaseSocket_*)>::~function(&this->m_fError);
  std::thread::~thread(&this->m_thClose);
  std::thread::~thread(&this->m_thWrite);
  std::thread::~thread(&this->m_thListen);
  std::__cxx11::string::~string((string *)&this->m_strName);
  return;
}

Assistant:

BaseSocketImpl::~BaseSocketImpl()
{
    if (m_thListen.joinable() == true)
        m_thListen.join();
    if (m_thWrite.joinable() == true)
        m_thWrite.join();
    if (m_thClose.joinable() == true)
        m_thClose.join();
}